

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O1

void __thiscall cmCTestGlobalVC::~cmCTestGlobalVC(cmCTestGlobalVC *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

cmCTestGlobalVC::~cmCTestGlobalVC()
{
}